

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O0

void __thiscall WorkSpace::status(WorkSpace *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  ostream *poVar4;
  ulong uVar5;
  LinkedReadsDatastore *in_RDI;
  int di_2;
  int di_1;
  int di;
  JournalOperation *j;
  iterator __end1;
  iterator __begin1;
  vector<JournalOperation,_std::allocator<JournalOperation>_> *__range1;
  LongReadsDatastore *in_stack_000000d0;
  SequenceDistanceGraph *in_stack_00000100;
  vector<JournalOperation,_std::allocator<JournalOperation>_> *in_stack_ffffffffffffff88;
  PairedReadsDatastore *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  int local_34;
  int local_30;
  int local_2c;
  __normal_iterator<JournalOperation_*,_std::vector<JournalOperation,_std::allocator<JournalOperation>_>_>
  local_18;
  LinkedReadsMapper *local_10;
  
  local_10 = &in_RDI[1].mapper;
  local_18._M_current =
       (JournalOperation *)
       std::vector<JournalOperation,_std::allocator<JournalOperation>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<JournalOperation,_std::allocator<JournalOperation>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<JournalOperation_*,_std::vector<JournalOperation,_std::allocator<JournalOperation>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<JournalOperation_*,_std::vector<JournalOperation,_std::allocator<JournalOperation>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<JournalOperation_*,_std::vector<JournalOperation,_std::allocator<JournalOperation>_>_>
    ::operator*(&local_18);
    JournalOperation::status((JournalOperation *)in_stack_ffffffffffffff90);
    __gnu_cxx::
    __normal_iterator<JournalOperation_*,_std::vector<JournalOperation,_std::allocator<JournalOperation>_>_>
    ::operator++(&local_18);
  }
  SequenceDistanceGraph::print_status(in_stack_00000100);
  poVar2 = sdglib::OutputLog((LogLevels)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
  poVar2 = std::operator<<(poVar2,"Workspace contains ");
  sVar3 = std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::size
                    ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)
                     &in_RDI->default_name);
  poVar4 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar4 = std::operator<<(poVar4," paired reads datastores");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_2c = 0;
  while( true ) {
    sVar3 = std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::size
                      ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)
                       &in_RDI->default_name);
    if (sVar3 <= (ulong)(long)local_2c) break;
    std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::operator[]
              ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)
               &in_RDI->default_name,(long)local_2c);
    PairedReadsDatastore::print_status(in_stack_ffffffffffffff90);
    local_2c = local_2c + 1;
  }
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)poVar2 >> 0x20),SUB81((ulong)poVar2 >> 0x18,0));
  poVar4 = std::operator<<(poVar4,"Workspace contains ");
  sVar3 = std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::size
                    ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)
                     ((long)&(in_RDI->default_name).field_2 + 8));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  poVar4 = std::operator<<(poVar4," linked reads datastores");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::size
                      ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)
                       ((long)&(in_RDI->default_name).field_2 + 8));
    if (sVar3 <= (ulong)(long)local_30) break;
    std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::operator[]
              ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)
               ((long)&(in_RDI->default_name).field_2 + 8),(long)local_30);
    LinkedReadsDatastore::print_status(in_RDI);
    local_30 = local_30 + 1;
  }
  poVar2 = sdglib::OutputLog((LogLevels)((ulong)poVar2 >> 0x20),SUB81((ulong)poVar2 >> 0x18,0));
  poVar2 = std::operator<<(poVar2,"Workspace contains ");
  sVar3 = std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::size
                    ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)
                     &(in_RDI->read_tag).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," long reads datastores");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_34 = 0;
  while( true ) {
    uVar5 = (ulong)local_34;
    sVar3 = std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::size
                      ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)
                       &(in_RDI->read_tag).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar3 <= uVar5) break;
    std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::operator[]
              ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)
               &(in_RDI->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_34);
    LongReadsDatastore::print_status(in_stack_000000d0);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void WorkSpace::status() {
    for (const auto &j:journal){
        j.status();
    }
    //graph
    sdg.print_status();

    //PR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< paired_reads_datastores.size() << " paired reads datastores" <<std::endl;
    for (auto di=0;di<paired_reads_datastores.size();++di){
        paired_reads_datastores[di].print_status();

    }
    //10x datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< linked_reads_datastores.size() << " linked reads datastores" <<std::endl;
    for (auto di=0;di<linked_reads_datastores.size();++di){
        linked_reads_datastores[di].print_status();
    }
    //LR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< long_reads_datastores.size() << " long reads datastores" <<std::endl;
    for (auto di=0;di<long_reads_datastores.size();++di){
        long_reads_datastores[di].print_status();
    }

}